

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void __thiscall cnn::AlignedMemoryPool<6U>::zero_all(AlignedMemoryPool<6U> *this)

{
  size_t *in_RDI;
  
  memset((void *)in_RDI[3],0,*in_RDI);
  return;
}

Assistant:

void zero_all() {
    //std::cerr << "zeroing " << (used ? used : capacity) << " bytes\n";
#if HAVE_CUDA
    CUDA_CHECK(cudaMemsetAsync(mem, 0, capacity));
#else
    std::memset(mem, 0, capacity);
#endif
  }